

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O1

uhugeint_t
duckdb::GetInternalCValue<duckdb::uhugeint_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  uhugeint_t uVar2;
  uhugeint_t local_28;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      uVar2 = TryCastCInternal<bool,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TINYINT:
      uVar2 = TryCastCInternal<signed_char,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_SMALLINT:
      uVar2 = TryCastCInternal<short,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_INTEGER:
      uVar2 = TryCastCInternal<int,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_BIGINT:
      uVar2 = TryCastCInternal<long,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UTINYINT:
      uVar2 = TryCastCInternal<unsigned_char,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_USMALLINT:
      uVar2 = TryCastCInternal<unsigned_short,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UINTEGER:
      uVar2 = TryCastCInternal<unsigned_int,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UBIGINT:
      uVar2 = TryCastCInternal<unsigned_long,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_FLOAT:
      uVar2 = TryCastCInternal<float,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DOUBLE:
      uVar2 = TryCastCInternal<double,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      uVar2 = TryCastCInternal<duckdb::timestamp_t,duckdb::uhugeint_t,duckdb::TryCast>
                        (result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DATE:
      uVar2 = TryCastCInternal<duckdb::date_t,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TIME:
      uVar2 = TryCastCInternal<duckdb::dtime_t,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_INTERVAL:
      uVar2 = TryCastCInternal<duckdb::interval_t,duckdb::uhugeint_t,duckdb::TryCast>
                        (result,col,row);
      return uVar2;
    case DUCKDB_TYPE_HUGEINT:
      uVar2 = TryCastCInternal<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::TryCast>(result,col,row)
      ;
      return uVar2;
    case DUCKDB_TYPE_VARCHAR:
      uVar2 = TryCastCInternal<char*,duckdb::uhugeint_t,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return uVar2;
    case DUCKDB_TYPE_BLOB:
      uVar2 = TryCastCInternal<duckdb_blob,duckdb::uhugeint_t,duckdb::FromCBlobCastWrapper>
                        (result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DECIMAL:
      uVar2 = TryCastDecimalCInternal<duckdb::uhugeint_t>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UHUGEINT:
      uVar2 = TryCastCInternal<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::TryCast>
                        (result,col,row);
      return uVar2;
    }
  }
  uhugeint_t::uhugeint_t(&local_28,0);
  return local_28;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}